

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HLSL2GLSLConverterImpl.cpp
# Opt level: O3

void __thiscall
Diligent::HLSL2GLSLConverterImpl::ConversionStream::RemoveFlowControlAttribute
          (ConversionStream *this,iterator *Token)

{
  _List_node_base *p_Var1;
  _List_node_base *p_Var2;
  char (*in_RCX) [23];
  _List_node_base *p_Var3;
  iterator __position;
  string msg;
  string local_40;
  
  p_Var3 = Token->_M_node;
  if (10 < *(int *)&p_Var3[1]._M_next - 0xc0U) {
    FormatString<char[26],char[23]>
              (&local_40,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"Token->IsFlowControl()",in_RCX);
    DebugAssertionFailed
              (local_40._M_dataplus._M_p,"RemoveFlowControlAttribute",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/HLSL2GLSLConverterLib/src/HLSL2GLSLConverterImpl.cpp"
               ,0x72e);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != &local_40.field_2) {
      operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
    }
    p_Var3 = Token->_M_node;
  }
  p_Var1 = p_Var3->_M_prev;
  p_Var2 = (this->m_Tokens).
           super__List_base<Diligent::Parsing::HLSLTokenInfo,_std::allocator<Diligent::Parsing::HLSLTokenInfo>_>
           ._M_impl._M_node.super__List_node_base._M_next;
  if ((((p_Var1 != p_Var2) && (*(int *)&p_Var1[1]._M_next == 0x138)) &&
      (p_Var1 = p_Var1->_M_prev, p_Var1 != p_Var2)) &&
     (((*(int *)&p_Var1[1]._M_next == 0x13b &&
       (__position._M_node = p_Var1->_M_prev, __position._M_node != p_Var2)) &&
      (*(int *)&__position._M_node[1]._M_next == 0x137)))) {
    std::__cxx11::string::_M_assign((string *)&p_Var3[3]._M_prev);
    p_Var3 = Token->_M_node;
    if (__position._M_node != p_Var3) {
      do {
        p_Var1 = (__position._M_node)->_M_next;
        std::__cxx11::
        list<Diligent::Parsing::HLSLTokenInfo,_std::allocator<Diligent::Parsing::HLSLTokenInfo>_>::
        _M_erase(&this->m_Tokens,__position);
        __position._M_node = p_Var1;
      } while (p_Var1 != p_Var3);
    }
  }
  return;
}

Assistant:

void HLSL2GLSLConverterImpl::ConversionStream::RemoveFlowControlAttribute(TokenListType::iterator& Token)
{
    VERIFY_EXPR(Token->IsFlowControl());
    // [ branch ] if ( ...
    //            ^
    auto PrevToken = Token;
    --PrevToken;
    // [ branch ] if ( ...
    //          ^
    // Note that dummy empty token is inserted into the beginning of the list
    if (PrevToken == m_Tokens.begin() || PrevToken->Type != TokenType::ClosingSquareBracket)
        return;

    --PrevToken;
    // [ branch ] if ( ...
    //   ^
    if (PrevToken == m_Tokens.begin() || PrevToken->Type != TokenType::Identifier)
        return;

    --PrevToken;
    // [ branch ] if ( ...
    // ^
    if (PrevToken == m_Tokens.begin() || PrevToken->Type != TokenType::OpenSquareBracket)
        return;

    //  [ branch ] if ( ...
    //  ^          ^
    // PrevToken   Token
    Token->Delimiter = PrevToken->Delimiter;
    m_Tokens.erase(PrevToken, Token);
}